

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_gen.c
# Opt level: O0

int yajl_gen_config(yajl_gen g,yajl_gen_option opt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  uint in_ESI;
  uint *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *indent;
  va_list ap;
  int rv;
  undefined8 *local_150;
  undefined8 *local_138;
  undefined1 local_e8 [16];
  char *local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  char *local_30;
  uint local_28;
  undefined4 local_24;
  undefined8 *local_20;
  undefined1 *local_18;
  int local_10;
  uint local_c;
  uint *local_8;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_10 = 1;
  local_18 = local_e8;
  local_20 = (undefined8 *)&stack0x00000008;
  local_24 = 0x30;
  local_28 = 0x10;
  switch(in_ESI) {
  case 1:
  case 8:
  case 0x10:
    local_10 = 1;
    if ((int)local_d8 == 0) {
      *in_RDI = (in_ESI ^ 0xffffffff) & *in_RDI;
    }
    else {
      *in_RDI = in_ESI | *in_RDI;
    }
    break;
  case 2:
    local_10 = 1;
    local_30 = local_d8;
    *(char **)(in_RDI + 2) = local_d8;
    for (; *local_30 != '\0'; local_30 = local_30 + 1) {
      if ((((*local_30 != '\n') && (*local_30 != '\v')) && (*local_30 != '\f')) &&
         (((*local_30 != '\t' && (*local_30 != '\r')) && (*local_30 != ' ')))) {
        in_RDI[2] = 0;
        in_RDI[3] = 0;
        local_10 = 0;
      }
    }
    break;
  default:
    local_10 = 0;
    break;
  case 4:
    local_d8 = (char *)in_RDX;
    local_d0 = in_RCX;
    local_c8 = in_R8;
    local_c0 = in_R9;
    local_c = in_ESI;
    local_8 = in_RDI;
    yajl_buf_free((yajl_buf)0x1080e8);
    if (local_28 < 0x29) {
      local_138 = (undefined8 *)(local_18 + (int)local_28);
      local_28 = local_28 + 8;
    }
    else {
      local_138 = local_20;
      local_20 = local_20 + 1;
    }
    *(undefined8 *)(local_8 + 0x84) = *local_138;
    if (local_28 < 0x29) {
      local_150 = (undefined8 *)(local_18 + (int)local_28);
    }
    else {
      local_150 = local_20;
    }
    *(undefined8 *)(local_8 + 0x86) = *local_150;
  }
  return local_10;
}

Assistant:

int
yajl_gen_config(yajl_gen g, yajl_gen_option opt, ...)
{
    int rv = 1;
    va_list ap;
    va_start(ap, opt);

    switch(opt) {
        case yajl_gen_beautify:
        case yajl_gen_validate_utf8:
        case yajl_gen_escape_solidus:
            if (va_arg(ap, int)) g->flags |= opt;
            else g->flags &= ~opt;
            break;
        case yajl_gen_indent_string: {
            const char *indent = va_arg(ap, const char *);
            g->indentString = indent;
            for (; *indent; indent++) {
                if (*indent != '\n'
                    && *indent != '\v'
                    && *indent != '\f'
                    && *indent != '\t'
                    && *indent != '\r'
                    && *indent != ' ')
                {
                    g->indentString = NULL;
                    rv = 0;
                }
            }
            break;
        }
        case yajl_gen_print_callback:
            yajl_buf_free(g->ctx);
            g->print = va_arg(ap, const yajl_print_t);
            g->ctx = va_arg(ap, void *);
            break;
        default:
            rv = 0;
    }

    va_end(ap);

    return rv;
}